

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-tree.c
# Opt level: O0

int get_item_for_cursor(coda_tree_node *node,int depth,coda_cursor *cursor,void **item)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long middle;
  long index;
  long top;
  long bottom;
  void **item_local;
  coda_cursor *cursor_local;
  int depth_local;
  coda_tree_node *node_local;
  
  if (node == (coda_tree_node *)0x0) {
    *item = (void *)0x0;
    return 0;
  }
  if (depth < cursor->n + -1) {
    if (0 < node->num_indexed_children) {
      top = 0;
      index = (long)(node->num_indexed_children + -1);
      lVar1 = cursor->stack[depth + 1].index;
      while (index != top) {
        lVar3 = (top + index) / 2;
        if (lVar1 <= node->index[lVar3]) {
          index = lVar3;
        }
        if (node->index[lVar3] < lVar1) {
          top = lVar3 + 1;
        }
      }
      if (lVar1 == node->index[index]) {
        iVar2 = get_item_for_cursor(node->indexed_child[index],depth + 1,cursor,item);
        if (iVar2 != 0) {
          return -1;
        }
        if (item != (void **)0x0) {
          return 0;
        }
      }
    }
    if (node->all_children != (coda_tree_node *)0x0) {
      iVar2 = get_item_for_cursor(node->all_children,depth + 1,cursor,item);
      if (iVar2 != 0) {
        return -1;
      }
      if (item != (void **)0x0) {
        return 0;
      }
    }
  }
  else if (0 < node->num_items) {
    *item = node->item[node->num_items + -1];
    return 0;
  }
  *item = (void *)0x0;
  return 0;
}

Assistant:

static int get_item_for_cursor(coda_tree_node *node, int depth, coda_cursor *cursor, void **item)
{
    if (node == NULL)
    {
        *item = NULL;
        return 0;
    }

    if (depth < cursor->n - 1)
    {
        /* specific indexed array elements take precedence over an 'all array elements' reference */
        if (node->num_indexed_children > 0)
        {
            long bottom = 0;
            long top = node->num_indexed_children - 1;
            long index = cursor->stack[depth + 1].index;

            while (top != bottom)
            {
                long middle = (bottom + top) / 2;

                if (index <= node->index[middle])
                {
                    top = middle;
                }
                if (index > node->index[middle])
                {
                    bottom = middle + 1;
                }
            }
            if (index == node->index[top])
            {
                if (get_item_for_cursor(node->indexed_child[top], depth + 1, cursor, item) != 0)
                {
                    return -1;
                }
                if (item != NULL)
                {
                    return 0;
                }
            }
        }
        if (node->all_children != NULL)
        {
            if (get_item_for_cursor(node->all_children, depth + 1, cursor, item) != 0)
            {
                return -1;
            }
            if (item != NULL)
            {
                return 0;
            }
        }
    }
    else if (node->num_items > 0)
    {
        /* return the last item in the list */
        *item = node->item[node->num_items - 1];
        return 0;
    }

    /* nothing found */
    *item = NULL;
    return 0;
}